

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

void __thiscall
ZoneHashEntryLink::ZoneHashEntryLink
          (ZoneHashEntryLink *this,char *str,size_t len,int copy,ZoneHashEntry *link_to)

{
  undefined8 uVar1;
  undefined8 *in_RDI;
  long *in_R8;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  ZoneHashEntry *in_stack_ffffffffffffffd0;
  
  ZoneHashEntry::ZoneHashEntry
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  *in_RDI = &PTR__ZoneHashEntryLink_004449f8;
  uVar1 = (**(code **)(*in_R8 + 0x18))();
  in_RDI[8] = uVar1;
  in_RDI[9] = in_R8[6];
  *(undefined8 **)(in_RDI[8] + 0x30) = in_RDI;
  return;
}

Assistant:

ZoneHashEntryLink(const char *str, size_t len, int copy,
                      ZoneHashEntry *link_to)
        : ZoneHashEntry(str, len, copy, ZONE_HASH_LINK)
    {
        /* add myself to the target's 'from' list */
        this->link_to = link_to->resolve_links();
        link_nxt = link_to->link_from;
        this->link_to->link_from = this;
    }